

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallArgs.cpp
# Opt level: O1

void __thiscall CallArgs::~CallArgs(CallArgs *this)

{
  _Base_ptr this_00;
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->variables)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    this_00 = p_Var1[1]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      Variable::~Variable((Variable *)this_00);
      operator_delete(this_00);
    }
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Variable_*>,_std::_Select1st<std::pair<const_unsigned_int,_Variable_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Variable_*>_>_>
  ::clear(&(this->variables)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Variable_*>,_std::_Select1st<std::pair<const_unsigned_int,_Variable_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Variable_*>_>_>
  ::~_Rb_tree(&(this->variables)._M_t);
  return;
}

Assistant:

CallArgs::~CallArgs() {
	std::map<unsigned int, Variable*>::iterator iter;
	for (iter = this->variables.begin(); iter != this->variables.end(); iter++) {
		delete (*iter).second;
	}
	this->variables.clear();
}